

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleColsUp2_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  uint8_t uVar1;
  int j;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_ptr_local;
  uint8_t *dst_ptr_local;
  
  src_ptr_local = src_ptr;
  dst_ptr_local = dst_ptr;
  for (j = 0; j < dst_width + -1; j = j + 2) {
    uVar1 = *src_ptr_local;
    *dst_ptr_local = uVar1;
    dst_ptr_local[1] = uVar1;
    src_ptr_local = src_ptr_local + 1;
    dst_ptr_local = dst_ptr_local + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr_local = *src_ptr_local;
  }
  return;
}

Assistant:

void ScaleColsUp2_C(uint8_t* dst_ptr,
                    const uint8_t* src_ptr,
                    int dst_width,
                    int x,
                    int dx) {
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst_ptr[1] = dst_ptr[0] = src_ptr[0];
    src_ptr += 1;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    dst_ptr[0] = src_ptr[0];
  }
}